

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddGroupSiftingDown(DdManager *table,int x,int xHigh,DD_CHKFP checkFunction,Move **moves)

{
  int x_00;
  uint uVar1;
  uint uVar2;
  DdHalfWord DVar3;
  DdSubtable *pDVar4;
  Move *pMVar5;
  int iVar6;
  DdHalfWord y;
  int iVar7;
  DdNode *pDVar8;
  Move *pMVar9;
  DdHalfWord x_01;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int local_6c;
  int local_64;
  
  pDVar4 = table->subtables;
  uVar10 = (ulong)(uint)x;
  while (pDVar4[(int)uVar10].keys == 1) {
    uVar10 = (ulong)(int)pDVar4[(int)uVar10].next;
    if (pDVar4[uVar10].next == x) {
      return 1;
    }
  }
  x_00 = table->invperm[x];
  uVar1 = pDVar4[x].next;
  uVar2 = table->keys;
  iVar16 = table->isolated;
  lVar13 = (long)xHigh;
  lVar14 = lVar13 * 0xe + 4;
  local_6c = 0;
  for (; (int)uVar1 < lVar13; lVar13 = lVar13 + -1) {
    iVar7 = table->invperm[lVar13];
    if ((iVar7 == x_00) || (iVar6 = cuddTestInteract(table,x_00,iVar7), iVar6 != 0)) {
      local_6c = (local_6c - (uint)(table->vars[iVar7]->ref == 1)) +
                 *(int *)((long)&table->subtables->nodelist + lVar14 * 4);
    }
    lVar14 = lVar14 + -0xe;
  }
  iVar16 = uVar2 - iVar16;
  y = cuddNextHigh(table,x);
  local_64 = iVar16;
  do {
    if ((xHigh < (int)y) || (local_64 <= iVar16 - local_6c)) {
      return 1;
    }
    DVar3 = table->subtables[(int)y].next;
    do {
      x_01 = DVar3;
      lVar13 = (long)(int)x_01;
      DVar3 = table->subtables[lVar13].next;
    } while (DVar3 != y);
    iVar7 = (*checkFunction)(table,x,y);
    pDVar4 = table->subtables;
    DVar3 = pDVar4[x].next;
    if (iVar7 == 0) {
      if ((DVar3 != x) || (pDVar4[(int)y].next != y)) {
        lVar15 = (long)(int)DVar3;
        lVar14 = lVar15 * 0xe + 0x12;
        do {
          iVar16 = table->invperm[lVar15 + 1];
          if ((iVar16 == x_00) || (iVar7 = cuddTestInteract(table,x_00,iVar16), iVar7 != 0)) {
            local_6c = (local_6c + (uint)(table->vars[iVar16]->ref == 1)) -
                       *(int *)((long)&table->subtables->nodelist + lVar14 * 4);
          }
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 0xe;
        } while (lVar15 < lVar13);
        iVar16 = ddGroupMove(table,x,y,moves);
        if (iVar16 != 0) {
          if ((double)local_64 * table->maxGrowth < (double)iVar16) {
            return 1;
          }
          lVar14 = (long)(int)table->subtables[lVar13].next;
          do {
            lVar15 = lVar14 * 0xe + 0x12;
            do {
              lVar12 = lVar15;
              lVar11 = lVar14;
              if (lVar13 <= lVar11) {
                if (iVar16 < local_64) {
                  local_64 = iVar16;
                }
                goto LAB_0073f999;
              }
              iVar7 = table->invperm[lVar11 + 1];
              if (iVar7 == x_00) break;
              iVar6 = cuddTestInteract(table,x_00,iVar7);
              lVar14 = lVar11 + 1;
              lVar15 = lVar12 + 0xe;
            } while (iVar6 == 0);
            local_6c = (local_6c - (uint)(table->vars[iVar7]->ref == 1)) +
                       *(int *)((long)&table->subtables->nodelist + lVar12 * 4);
            lVar14 = lVar11 + 1;
          } while( true );
        }
LAB_0073f9aa:
        pMVar9 = *moves;
        while (pMVar9 != (Move *)0x0) {
          pMVar5 = pMVar9->next;
          pMVar9->y = 0;
          *(DdNode **)&pMVar9->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar5;
          pMVar9 = pMVar5;
        }
        return 0;
      }
      iVar16 = table->invperm[(int)y];
      iVar7 = cuddTestInteract(table,x_00,iVar16);
      if (iVar7 != 0) {
        local_6c = (local_6c + (uint)(table->vars[iVar16]->ref == 1)) -
                   table->subtables[(int)y].keys;
      }
      iVar16 = cuddSwapInPlace(table,x,y);
      if ((iVar16 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
      goto LAB_0073f9aa;
      pDVar8->index = x;
      pDVar8->ref = y;
      *(undefined4 *)&pDVar8->next = 0;
      *(int *)((long)&pDVar8->next + 4) = iVar16;
      (pDVar8->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar8;
      if ((double)local_64 * table->maxGrowth < (double)iVar16) {
        return 1;
      }
      if (iVar16 < local_64) {
        local_64 = iVar16;
      }
      cuddNextHigh(table,y);
    }
    else {
      pDVar4[x].next = y;
      pDVar4[lVar13].next = DVar3;
      pDVar8 = cuddDynamicAllocNode(table);
      if (pDVar8 == (DdNode *)0x0) goto LAB_0073f9aa;
      pDVar8->index = x;
      pDVar8->ref = y;
      *(undefined4 *)&pDVar8->next = 8;
      *(uint *)((long)&pDVar8->next + 4) = table->keys - table->isolated;
      (pDVar8->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar8;
    }
LAB_0073f999:
    y = cuddNextHigh(table,x_01);
    x = x_01;
  } while( true );
}

Assistant:

static int
ddGroupSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated, allVars;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    /* If the group consists of simple variables, there is no point in
    ** sifting it down. This check is redundant if the projection functions
    ** do not have external references, because the computation of the
    ** lower bound takes care of the problem.  It is necessary otherwise to
    ** prevent the sifting down of simple variables. */
    y = x;
    allVars = 1;
    do {
        if (table->subtables[y].keys != 1) {
            allVars = 0;
            break;
        }
        y = table->subtables[y].next;
    } while (table->subtables[y].next != (unsigned) x);
    if (allVars)
        return(1);

    /* Initialize R. */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R >= checkR);
#endif
        /* Find bottom of y group. */
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;

        if (checkFunction(table,x,y)) {
            /* Group found: attach groups and record move. */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingDownOutOfMem;

            /* Record move. */
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingDown (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            x = y;
            y = cuddNextHigh(table,x);
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(1);

ddGroupSiftingDownOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }

    return(0);

}